

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_islow(DCTELEM *data)

{
  short sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  undefined1 auVar38 [12];
  undefined1 auVar39 [16];
  short sVar47;
  undefined1 auVar42 [16];
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  long lVar48;
  long lVar53;
  long lVar54;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar56;
  ulong uVar58;
  undefined1 auVar57 [16];
  ulong uVar59;
  ulong uVar61;
  undefined1 auVar60 [16];
  undefined1 auVar65 [12];
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  undefined1 in_XMM4 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  long lVar73;
  int iVar84;
  undefined1 auVar74 [12];
  int iVar83;
  int iVar85;
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar90;
  long lVar91;
  undefined1 auVar89 [16];
  ulong uVar92;
  long lVar93;
  ulong uVar95;
  undefined1 auVar94 [16];
  long lVar96;
  int iVar103;
  ulong uVar97;
  long lVar98;
  undefined1 auVar99 [12];
  int iVar104;
  undefined2 in_XMM9_Wh;
  int iVar106;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  long lVar105;
  long lVar107;
  long lVar111;
  undefined1 auVar109 [16];
  long lVar108;
  long lVar112;
  undefined1 auVar110 [16];
  long lVar113;
  long lVar114;
  long lVar116;
  undefined1 auVar115 [16];
  long lVar117;
  int iVar125;
  ulong uVar118;
  int iVar126;
  undefined1 in_XMM12 [16];
  undefined1 auVar121 [16];
  long lVar119;
  long lVar120;
  long lVar127;
  long lVar128;
  undefined1 auVar124 [16];
  long lVar129;
  long lVar130;
  ulong uVar132;
  long lVar133;
  long lVar134;
  undefined1 auVar131 [16];
  int iVar139;
  long lVar135;
  long lVar136;
  undefined1 auVar137 [12];
  int iVar140;
  undefined2 in_XMM14_Wh;
  int iVar142;
  long lVar141;
  int iVar148;
  ulong uVar143;
  long lVar144;
  int iVar149;
  undefined1 in_XMM15 [16];
  undefined1 auVar145 [16];
  long lVar150;
  ulong uStack_240;
  ulong uStack_230;
  ulong uStack_220;
  ulong uStack_210;
  ulong uStack_1f0;
  ulong uStack_1d0;
  ulong uStack_1c0;
  ulong uStack_1b0;
  ulong uStack_1a0;
  ulong uStack_190;
  ulong uStack_180;
  ulong uStack_170;
  ulong uStack_160;
  ulong uStack_140;
  ulong uStack_130;
  ulong uStack_120;
  ulong uStack_110;
  ulong uStack_100;
  ulong uStack_f0;
  ulong uStack_e0;
  ulong uStack_d0;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  ulong uVar55;
  undefined1 auVar70 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar79 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  int iVar82;
  undefined1 auVar100 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar138 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  
  lVar18 = 0;
  do {
    iVar19 = (int)*(short *)((long)data + lVar18 + 0xe);
    iVar27 = iVar19 + *(short *)((long)data + lVar18);
    iVar19 = *(short *)((long)data + lVar18) - iVar19;
    iVar20 = (int)*(short *)((long)data + lVar18 + 2);
    iVar22 = (int)*(short *)((long)data + lVar18 + 0xc);
    iVar26 = iVar22 + iVar20;
    iVar20 = iVar20 - iVar22;
    iVar23 = (int)*(short *)((long)data + lVar18 + 4);
    iVar24 = (int)*(short *)((long)data + lVar18 + 10);
    iVar22 = iVar24 + iVar23;
    iVar23 = iVar23 - iVar24;
    iVar25 = (int)*(short *)((long)data + lVar18 + 6);
    iVar21 = (int)*(short *)((long)data + lVar18 + 8);
    iVar24 = iVar21 + iVar25;
    iVar25 = iVar25 - iVar21;
    sVar47 = (short)iVar24 + (short)iVar27;
    iVar27 = iVar27 - iVar24;
    sVar1 = (short)iVar22 + (short)iVar26;
    iVar26 = iVar26 - iVar22;
    *(short *)((long)data + lVar18) = (sVar47 + sVar1) * 4;
    *(short *)((long)data + lVar18 + 8) = (sVar47 - sVar1) * 4;
    iVar22 = (iVar27 + iVar26) * 0x1151;
    *(short *)((long)data + lVar18 + 4) = (short)(iVar27 * 0x187e + iVar22 + 0x400U >> 0xb);
    *(short *)((long)data + lVar18 + 0xc) = (short)(iVar26 * 0x7ffc4df + iVar22 + 0x400U >> 0xb);
    iVar26 = (iVar25 + iVar20 + iVar23 + iVar19) * 0x25a1;
    iVar27 = (iVar25 + iVar19) * -0x1ccd;
    iVar22 = (iVar23 + iVar20) * -0x5203;
    iVar24 = (iVar25 + iVar20) * -0x3ec5 + iVar26;
    iVar26 = (iVar23 + iVar19) * -0xc7c + iVar26;
    *(short *)((long)data + lVar18 + 0xe) =
         (short)((uint)(iVar25 * 0x98e + iVar27 + 0x400 + iVar24) >> 0xb);
    *(short *)((long)data + lVar18 + 10) =
         (short)((uint)(iVar22 + iVar23 * 0x41b3 + 0x400 + iVar26) >> 0xb);
    *(short *)((long)data + lVar18 + 6) =
         (short)((uint)(iVar22 + iVar20 * 0x6254 + 0x400 + iVar24) >> 0xb);
    *(short *)((long)data + lVar18 + 2) =
         (short)((uint)(iVar19 * 0x300b + iVar27 + 0x400 + iVar26) >> 0xb);
    lVar18 = lVar18 + 0x10;
  } while ((int)lVar18 != 0x80);
  auVar51 = *(undefined1 (*) [16])(data + 0x10);
  auVar123._0_12_ = in_XMM12._0_12_;
  auVar123._12_2_ = in_XMM12._6_2_;
  auVar123._14_2_ = data[3];
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._0_10_ = in_XMM12._0_10_;
  auVar122._10_2_ = data[2];
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._0_8_ = in_XMM12._0_8_;
  auVar121._8_2_ = in_XMM12._4_2_;
  auVar9._4_8_ = auVar121._8_8_;
  auVar9._2_2_ = data[1];
  auVar9._0_2_ = in_XMM12._2_2_;
  iVar125 = auVar9._0_4_ >> 0x10;
  iVar126 = auVar121._8_4_ >> 0x10;
  auVar99._0_10_ = (unkuint10)(ushort)data[5] << 0x30;
  auVar99._10_2_ = data[6];
  auVar100._12_2_ = in_XMM9_Wh;
  auVar100._0_12_ = auVar99;
  auVar100._14_2_ = data[7];
  iVar103 = (int)((long)((ulong)(ushort)data[5] << 0x30) >> 0x30);
  iVar104 = auVar99._8_4_ >> 0x10;
  iVar106 = auVar100._12_4_ >> 0x10;
  sVar47 = data[0x39];
  auVar68._0_12_ = in_XMM4._0_12_;
  auVar68._12_2_ = in_XMM4._6_2_;
  auVar68._14_2_ = data[0x3b];
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._0_10_ = in_XMM4._0_10_;
  auVar67._10_2_ = data[0x3a];
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._0_8_ = in_XMM4._0_8_;
  auVar66._8_2_ = in_XMM4._4_2_;
  auVar10._4_8_ = auVar66._8_8_;
  auVar10._2_2_ = sVar47;
  auVar10._0_2_ = in_XMM4._2_2_;
  auVar69._0_4_ = (int)data[0x38];
  iVar20 = auVar10._0_4_ >> 0x10;
  auVar65._0_8_ = CONCAT44(iVar20,auVar69._0_4_);
  auVar65._8_4_ = auVar66._8_4_ >> 0x10;
  auVar147._0_12_ = in_XMM15._0_12_;
  auVar147._12_2_ = in_XMM15._6_2_;
  auVar147._14_2_ = data[0xb];
  auVar146._12_4_ = auVar147._12_4_;
  auVar146._0_10_ = in_XMM15._0_10_;
  auVar146._10_2_ = data[10];
  auVar145._10_6_ = auVar146._10_6_;
  auVar145._0_8_ = in_XMM15._0_8_;
  auVar145._8_2_ = in_XMM15._4_2_;
  auVar11._4_8_ = auVar145._8_8_;
  auVar11._2_2_ = data[9];
  auVar11._0_2_ = in_XMM15._2_2_;
  iVar148 = auVar11._0_4_ >> 0x10;
  iVar149 = auVar145._8_4_ >> 0x10;
  auVar137._0_10_ = (unkuint10)(ushort)data[0xd] << 0x30;
  auVar137._10_2_ = data[0xe];
  auVar138._12_2_ = in_XMM14_Wh;
  auVar138._0_12_ = auVar137;
  auVar138._14_2_ = data[0xf];
  iVar139 = (int)((long)((ulong)(ushort)data[0xd] << 0x30) >> 0x30);
  iVar140 = auVar137._8_4_ >> 0x10;
  iVar142 = auVar138._12_4_ >> 0x10;
  sVar1 = data[0x35];
  auVar72._12_2_ = sVar47 >> 0xf;
  auVar72._0_12_ = auVar65;
  auVar72._14_2_ = data[0x33];
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._0_10_ = auVar65._0_10_;
  auVar71._10_2_ = data[0x32];
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = sVar47;
  auVar70._0_8_ = auVar65._0_8_;
  auVar69._8_8_ = auVar70._8_8_;
  auVar69._6_2_ = data[0x31];
  auVar69._4_2_ = data[0x38] >> 0xf;
  iVar21 = auVar69._4_4_ >> 0x10;
  iVar23 = auVar70._8_4_ >> 0x10;
  auVar102._0_4_ = (int)data[0x34];
  iVar27 = (int)sVar1;
  auVar38._0_8_ = CONCAT44(iVar27,auVar102._0_4_);
  auVar38._8_4_ = (int)data[0x36];
  auVar41._12_2_ = sVar1 >> 0xf;
  auVar41._0_12_ = auVar38;
  auVar41._14_2_ = auVar51._6_2_;
  auVar40._12_4_ = auVar41._12_4_;
  auVar40._0_10_ = auVar38._0_10_;
  auVar40._10_2_ = auVar51._4_2_;
  auVar39._10_6_ = auVar40._10_6_;
  auVar39._8_2_ = sVar1;
  auVar39._0_8_ = auVar38._0_8_;
  auVar102._8_8_ = auVar39._8_8_;
  auVar102._6_2_ = auVar51._2_2_;
  auVar102._4_2_ = data[0x34] >> 0xf;
  iVar26 = auVar102._4_4_ >> 0x10;
  iVar24 = auVar39._8_4_ >> 0x10;
  auVar77._0_12_ = auVar51._0_12_;
  auVar77._12_2_ = auVar51._6_2_;
  auVar77._14_2_ = data[0x2b];
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._0_10_ = auVar51._0_10_;
  auVar76._10_2_ = data[0x2a];
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._0_8_ = auVar51._0_8_;
  auVar75._8_2_ = auVar51._4_2_;
  auVar12._4_8_ = auVar75._8_8_;
  auVar12._2_2_ = data[0x29];
  auVar12._0_2_ = auVar51._2_2_;
  iVar25 = auVar12._0_4_ >> 0x10;
  iVar84 = auVar75._8_4_ >> 0x10;
  auVar39 = *(undefined1 (*) [16])(data + 0x20);
  sVar47 = auVar39._10_2_;
  auVar78._0_4_ = (int)auVar39._8_2_;
  iVar82 = (int)sVar47;
  auVar74._0_8_ = CONCAT44(iVar82,auVar78._0_4_);
  auVar74._8_4_ = (int)auVar39._12_2_;
  auVar81._12_2_ = sVar47 >> 0xf;
  auVar81._0_12_ = auVar74;
  auVar81._14_2_ = data[0x1b];
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._0_10_ = auVar74._0_10_;
  auVar80._10_2_ = data[0x1a];
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = sVar47;
  auVar79._0_8_ = auVar74._0_8_;
  auVar78._8_8_ = auVar79._8_8_;
  auVar78._6_2_ = data[0x19];
  auVar78._4_2_ = auVar39._8_2_ >> 0xf;
  iVar83 = auVar78._4_4_ >> 0x10;
  iVar85 = auVar79._8_4_ >> 0x10;
  auVar44._0_12_ = auVar39._0_12_;
  auVar44._12_2_ = auVar39._6_2_;
  auVar44._14_2_ = auVar39._6_2_;
  auVar43._12_4_ = auVar44._12_4_;
  auVar43._0_10_ = auVar39._0_10_;
  auVar43._10_2_ = auVar39._4_2_;
  auVar42._10_6_ = auVar43._10_6_;
  auVar42._0_8_ = auVar39._0_8_;
  auVar42._8_2_ = auVar39._4_2_;
  auVar13._4_8_ = auVar42._8_8_;
  auVar13._2_2_ = auVar39._2_2_;
  auVar13._0_2_ = auVar39._2_2_;
  iVar22 = auVar13._0_4_ >> 0x10;
  iVar19 = auVar42._8_4_ >> 0x10;
  uVar88 = (ulong)(uint)(auVar65._8_4_ + iVar126);
  uVar61 = (ulong)(uint)(iVar20 + iVar125);
  uVar59 = (ulong)(uint)(auVar69._0_4_ + *data);
  uVar86 = (ulong)(uint)(data[0x3e] + iVar104);
  uVar58 = (ulong)(uint)(data[0x3d] + iVar103);
  uVar56 = (ulong)(uint)((int)data[0x3c] + (int)data[4]);
  uVar28 = (ulong)(uint)(iVar126 - auVar65._8_4_);
  uVar2 = (ulong)(uint)(*data - auVar69._0_4_);
  uVar29 = (ulong)(uint)(iVar104 - data[0x3e]);
  uVar3 = (ulong)(uint)((int)data[4] - (int)data[0x3c]);
  uVar37 = (ulong)(uint)(iVar23 + iVar149);
  uVar95 = (ulong)(uint)(iVar21 + iVar148);
  uVar92 = (ulong)(uint)((int)data[0x30] + (int)data[8]);
  uVar36 = (ulong)(uint)(auVar38._8_4_ + iVar140);
  uVar35 = (ulong)(uint)(auVar102._0_4_ + data[0xc]);
  uVar30 = (ulong)(uint)(iVar149 - iVar23);
  uVar4 = (ulong)(uint)((int)data[8] - (int)data[0x30]);
  uVar31 = (ulong)(uint)(iVar140 - auVar38._8_4_);
  uVar5 = (ulong)(uint)(data[0xc] - auVar102._0_4_);
  uVar32 = (ulong)(uint)(iVar84 + iVar24);
  uVar14 = (ulong)(uint)((int)data[0x28] + (int)auVar51._0_2_);
  uVar97 = (ulong)(uint)((int)data[0x2e] + (int)auVar51._12_2_);
  uVar15 = (ulong)(uint)((int)data[0x2d] + (int)auVar51._10_2_);
  uVar16 = (ulong)(uint)((int)data[0x2c] + (int)auVar51._8_2_);
  uVar118 = (ulong)(uint)(iVar24 - iVar84);
  uVar17 = (ulong)(uint)((int)auVar51._0_2_ - (int)data[0x28]);
  uVar33 = (ulong)(uint)((int)auVar51._12_2_ - (int)data[0x2e]);
  uVar6 = (ulong)(uint)((int)auVar51._8_2_ - (int)data[0x2c]);
  uVar34 = (ulong)(uint)(iVar19 + iVar85);
  uVar132 = (ulong)(uint)(iVar22 + iVar83);
  uVar55 = (ulong)(uint)((int)auVar39._0_2_ + (int)data[0x18]);
  uVar143 = (ulong)(uint)(auVar74._8_4_ + data[0x1e]);
  uVar90 = (ulong)(uint)(iVar82 + data[0x1d]);
  uVar87 = (ulong)(uint)(auVar78._0_4_ + data[0x1c]);
  uVar62 = (ulong)(uint)(iVar85 - iVar19);
  uVar7 = (ulong)(uint)((int)data[0x18] - (int)auVar39._0_2_);
  uVar63 = (ulong)(uint)(data[0x1e] - auVar74._8_4_);
  uVar8 = (ulong)(uint)(data[0x1c] - auVar78._0_4_);
  lVar107 = uVar87 + uVar56;
  lVar111 = uVar90 + uVar58;
  uVar56 = uVar56 - uVar87;
  uVar58 = uVar58 - uVar90;
  uVar90 = (ulong)(uint)((int)auVar39._14_2_ + (int)data[0x1f]);
  lVar119 = uVar143 + uVar86;
  uVar87 = (ulong)(uint)(data[0x3f] + iVar106);
  lVar127 = uVar90 + uVar87;
  uVar86 = uVar86 - uVar143;
  uVar87 = uVar87 - uVar90;
  lVar113 = uVar55 + uVar59;
  lVar116 = uVar132 + uVar61;
  uVar59 = uVar59 - uVar55;
  uVar61 = uVar61 - uVar132;
  uVar55 = (ulong)(uint)((auVar43._12_4_ >> 0x10) + (auVar80._12_4_ >> 0x10));
  lVar129 = uVar34 + uVar88;
  uVar90 = (ulong)(uint)((auVar67._12_4_ >> 0x10) + (auVar122._12_4_ >> 0x10));
  lVar133 = uVar55 + uVar90;
  uVar88 = uVar88 - uVar34;
  uVar90 = uVar90 - uVar55;
  uStack_240 = (ulong)(uint)(iVar27 + iVar139);
  lVar18 = uVar16 + uVar35;
  lVar53 = uVar15 + uStack_240;
  uVar35 = uVar35 - uVar16;
  uStack_240 = uStack_240 - uVar15;
  uStack_230 = (ulong)(uint)(data[0x37] + iVar142);
  uVar55 = (ulong)(uint)((int)data[0x2f] + (int)auVar51._14_2_);
  lVar48 = uVar97 + uVar36;
  lVar54 = uVar55 + uStack_230;
  uVar36 = uVar36 - uVar97;
  uStack_230 = uStack_230 - uVar55;
  uStack_210 = (ulong)(uint)(iVar25 + iVar26);
  lVar64 = uVar14 + uVar92;
  lVar73 = uStack_210 + uVar95;
  uVar92 = uVar92 - uVar14;
  uVar95 = uVar95 - uStack_210;
  uStack_1d0 = (ulong)(uint)((auVar76._12_4_ >> 0x10) + (auVar40._12_4_ >> 0x10));
  uStack_220 = (ulong)(uint)((auVar71._12_4_ >> 0x10) + (auVar146._12_4_ >> 0x10));
  lVar135 = uVar32 + uVar37;
  uVar37 = uVar37 - uVar32;
  auVar45._0_4_ = (int)(short)(lVar18 + lVar107 + 2U >> 2);
  auVar45._4_4_ = (int)(short)(lVar53 + lVar111 + 2U >> 2);
  auVar45._8_4_ = (int)(short)(lVar48 + lVar119 + 2U >> 2);
  auVar45._12_4_ = (int)(short)(lVar54 + lVar127 + 2U >> 2);
  auVar101._0_4_ = (int)(short)(lVar64 + lVar113 + 2U >> 2);
  auVar101._4_4_ = (int)(short)(lVar73 + lVar116 + 2U >> 2);
  auVar101._8_4_ = (int)(short)(lVar135 + lVar129 + 2U >> 2);
  auVar101._12_4_ = (int)(short)(uStack_1d0 + uStack_220 + lVar133 + 2 >> 2);
  auVar102 = packssdw(auVar101,auVar45);
  *(undefined1 (*) [16])data = auVar102;
  auVar109._0_4_ = (int)(short)((lVar107 - lVar18) + 2U >> 2);
  auVar109._4_4_ = (int)(short)((lVar111 - lVar53) + 2U >> 2);
  auVar109._8_4_ = (int)(short)((lVar119 - lVar48) + 2U >> 2);
  auVar109._12_4_ = (int)(short)((lVar127 - lVar54) + 2U >> 2);
  auVar115._0_4_ = (int)(short)((lVar113 - lVar64) + 2U >> 2);
  auVar115._4_4_ = (int)(short)((lVar116 - lVar73) + 2U >> 2);
  auVar115._8_4_ = (int)(short)((lVar129 - lVar135) + 2U >> 2);
  auVar115._12_4_ = (int)(short)((lVar133 - (uStack_1d0 + uStack_220)) + 2 >> 2);
  auVar102 = packssdw(auVar115,auVar109);
  *(undefined1 (*) [16])(data + 0x20) = auVar102;
  lVar107 = (uVar88 + uVar37 & 0xffffffff) * 0x1151 + 0x4000;
  lVar111 = (uVar90 + (uStack_220 - uStack_1d0) & 0xffffffff) * 0x1151 + 0x4000;
  lVar64 = (uVar59 + uVar92 & 0xffffffff) * 0x1151 + 0x4000;
  lVar73 = (uVar61 + uVar95 & 0xffffffff) * 0x1151 + 0x4000;
  lVar53 = (uVar86 + uVar36 & 0xffffffff) * 0x1151 + 0x4000;
  lVar54 = (uVar87 + uStack_230 & 0xffffffff) * 0x1151 + 0x4000;
  lVar18 = (uVar56 + uVar35 & 0xffffffff) * 0x1151 + 0x4000;
  lVar48 = (uVar58 + uStack_240 & 0xffffffff) * 0x1151 + 0x4000;
  auVar57._0_4_ = (int)(short)((uVar56 & 0xffffffff) * 0x187e + lVar18 >> 0xf);
  auVar57._4_4_ = (int)(short)((uVar58 & 0xffffffff) * 0x187e + lVar48 >> 0xf);
  auVar57._8_4_ = (int)(short)((uVar86 & 0xffffffff) * 0x187e + lVar53 >> 0xf);
  auVar57._12_4_ = (int)(short)((uVar87 & 0xffffffff) * 0x187e + lVar54 >> 0xf);
  auVar60._0_4_ = (int)(short)((uVar59 & 0xffffffff) * 0x187e + lVar64 >> 0xf);
  auVar60._4_4_ = (int)(short)((uVar61 & 0xffffffff) * 0x187e + lVar73 >> 0xf);
  auVar60._8_4_ = (int)(short)((uVar88 & 0xffffffff) * 0x187e + lVar107 >> 0xf);
  auVar60._12_4_ = (int)(short)((uVar90 & 0xffffffff) * 0x187e + lVar111 >> 0xf);
  auVar102 = packssdw(auVar60,auVar57);
  *(undefined1 (*) [16])(data + 0x10) = auVar102;
  auVar49._0_4_ = (int)(short)((uVar35 & 0xffffffff) * 0x7fffc4df + lVar18 >> 0xf);
  auVar49._4_4_ = (int)(short)((uStack_240 & 0xffffffff) * 0x7fffc4df + lVar48 >> 0xf);
  auVar49._8_4_ = (int)(short)((uVar36 & 0xffffffff) * 0x7fffc4df + lVar53 >> 0xf);
  auVar49._12_4_ = (int)(short)((uStack_230 & 0xffffffff) * 0x7fffc4df + lVar54 >> 0xf);
  auVar94._0_4_ = (int)(short)((uVar92 & 0xffffffff) * 0x7fffc4df + lVar64 >> 0xf);
  auVar94._4_4_ = (int)(short)((uVar95 & 0xffffffff) * 0x7fffc4df + lVar73 >> 0xf);
  auVar94._8_4_ = (int)(short)((uVar37 & 0xffffffff) * 0x7fffc4df + lVar107 >> 0xf);
  auVar94._12_4_ =
       (int)(short)((uStack_220 - uStack_1d0 & 0xffffffff) * 0x7fffc4df + lVar111 >> 0xf);
  auVar102 = packssdw(auVar94,auVar49);
  *(undefined1 (*) [16])(data + 0x30) = auVar102;
  uStack_140 = (ulong)(uint)(data[0x1d] - iVar82);
  uStack_180 = (ulong)(uint)(iVar139 - iVar27);
  uStack_1f0 = (ulong)(uint)((int)auVar51._10_2_ - (int)data[0x2d]);
  uStack_170 = (ulong)(uint)(iVar103 - data[0x3d]);
  lVar64 = (uVar8 + uVar5 + uVar6 + uVar3 & 0xffffffff) * 0x25a1;
  lVar111 = (uStack_140 + uStack_180 + uStack_1f0 + uStack_170 & 0xffffffff) * 0x25a1;
  uStack_130 = (ulong)(uint)((int)data[0x1f] - (int)auVar39._14_2_);
  uStack_1a0 = (ulong)(uint)(iVar142 - data[0x37]);
  uStack_120 = (ulong)(uint)((int)auVar51._14_2_ - (int)data[0x2f]);
  uStack_160 = (ulong)(uint)(iVar106 - data[0x3f]);
  lVar54 = (uVar63 + uVar31 + uVar33 + uVar29 & 0xffffffff) * 0x25a1;
  lVar107 = (uStack_130 + uStack_1a0 + uStack_120 + uStack_160 & 0xffffffff) * 0x25a1;
  uStack_110 = (ulong)(uint)(iVar83 - iVar22);
  uStack_1b0 = (ulong)(uint)(iVar148 - iVar21);
  uStack_1c0 = (ulong)(uint)(iVar26 - iVar25);
  uStack_190 = (ulong)(uint)(iVar125 - iVar20);
  lVar53 = (uVar7 + uVar4 + uVar17 + uVar2 & 0xffffffff) * 0x25a1;
  lVar73 = (uStack_110 + uStack_1b0 + uStack_1c0 + uStack_190 & 0xffffffff) * 0x25a1;
  uStack_100 = (ulong)(uint)((auVar80._12_4_ >> 0x10) - (auVar43._12_4_ >> 0x10));
  uStack_e0 = (ulong)(uint)((auVar146._12_4_ >> 0x10) - (auVar71._12_4_ >> 0x10));
  uStack_f0 = (ulong)(uint)((auVar40._12_4_ >> 0x10) - (auVar76._12_4_ >> 0x10));
  uStack_d0 = (ulong)(uint)((auVar122._12_4_ >> 0x10) - (auVar67._12_4_ >> 0x10));
  lVar18 = (uVar62 + uVar30 + uVar118 + uVar28 & 0xffffffff) * 0x25a1;
  lVar48 = (uStack_100 + uStack_e0 + uStack_f0 + uStack_d0 & 0xffffffff) * 0x25a1;
  lVar129 = (uVar62 + uVar30 & 0xffffffff) * 0xffffc13b + lVar18;
  lVar133 = (uStack_100 + uStack_e0 & 0xffffffff) * 0xffffc13b + lVar48;
  lVar18 = (uVar118 + uVar28 & 0xffffffff) * 0xfffff384 + lVar18;
  lVar48 = (uStack_f0 + uStack_d0 & 0xffffffff) * 0xfffff384 + lVar48;
  lVar113 = (uVar7 + uVar4 & 0xffffffff) * 0xffffc13b + lVar53;
  lVar116 = (uStack_110 + uStack_1b0 & 0xffffffff) * 0xffffc13b + lVar73;
  lVar53 = (uVar17 + uVar2 & 0xffffffff) * 0xfffff384 + lVar53;
  lVar73 = (uStack_1c0 + uStack_190 & 0xffffffff) * 0xfffff384 + lVar73;
  lVar119 = (uVar63 + uVar31 & 0xffffffff) * 0xffffc13b + lVar54;
  lVar127 = (uStack_130 + uStack_1a0 & 0xffffffff) * 0xffffc13b + lVar107;
  lVar54 = (uVar33 + uVar29 & 0xffffffff) * 0xfffff384 + lVar54;
  lVar107 = (uStack_120 + uStack_160 & 0xffffffff) * 0xfffff384 + lVar107;
  lVar144 = (uVar8 + uVar5 & 0xffffffff) * 0xffffc13b + lVar64;
  lVar150 = (uStack_140 + uStack_180 & 0xffffffff) * 0xffffc13b + lVar111;
  lVar64 = (uVar6 + uVar3 & 0xffffffff) * 0xfffff384 + lVar64;
  lVar111 = (uStack_1f0 + uStack_170 & 0xffffffff) * 0xfffff384 + lVar111;
  lVar120 = (uVar8 + uVar3 & 0xffffffff) * 0xffffe333 + 0x4000;
  lVar128 = (uStack_140 + uStack_170 & 0xffffffff) * 0xffffe333 + 0x4000;
  lVar93 = (uVar63 + uVar29 & 0xffffffff) * 0xffffe333 + 0x4000;
  lVar96 = (uStack_130 + uStack_160 & 0xffffffff) * 0xffffe333 + 0x4000;
  lVar130 = (uVar7 + uVar2 & 0xffffffff) * 0xffffe333 + 0x4000;
  lVar134 = (uStack_110 + uStack_190 & 0xffffffff) * 0xffffe333 + 0x4000;
  lVar98 = (uVar62 + uVar28 & 0xffffffff) * 0xffffe333 + 0x4000;
  lVar105 = (uStack_100 + uStack_d0 & 0xffffffff) * 0xffffe333 + 0x4000;
  auVar51._0_4_ = (int)(short)(uVar8 * 0x98e + lVar120 + lVar144 >> 0xf);
  auVar51._4_4_ = (int)(short)(uStack_140 * 0x98e + lVar128 + lVar150 >> 0xf);
  auVar51._8_4_ = (int)(short)(uVar63 * 0x98e + lVar93 + lVar119 >> 0xf);
  auVar51._12_4_ = (int)(short)(uStack_130 * 0x98e + lVar96 + lVar127 >> 0xf);
  auVar50._0_4_ = (int)(short)(uVar7 * 0x98e + lVar130 + lVar113 >> 0xf);
  auVar50._4_4_ = (int)(short)(uStack_110 * 0x98e + lVar134 + lVar116 >> 0xf);
  auVar50._8_4_ = (int)(short)(uVar62 * 0x98e + lVar98 + lVar129 >> 0xf);
  auVar50._12_4_ = (int)(short)(uStack_100 * 0x98e + lVar105 + lVar133 >> 0xf);
  auVar51 = packssdw(auVar50,auVar51);
  *(undefined1 (*) [16])(data + 0x38) = auVar51;
  lVar108 = (uVar6 + uVar5 & 0xffffffff) * 0xffffadfd + 0x4000;
  lVar112 = (uStack_1f0 + uStack_180 & 0xffffffff) * 0xffffadfd + 0x4000;
  lVar136 = (uVar33 + uVar31 & 0xffffffff) * 0xffffadfd + 0x4000;
  lVar141 = (uStack_120 + uStack_1a0 & 0xffffffff) * 0xffffadfd + 0x4000;
  lVar135 = (uVar17 + uVar4 & 0xffffffff) * 0xffffadfd + 0x4000;
  lVar91 = (uStack_1c0 + uStack_1b0 & 0xffffffff) * 0xffffadfd + 0x4000;
  lVar114 = (uVar118 + uVar30 & 0xffffffff) * 0xffffadfd + 0x4000;
  lVar117 = (uStack_f0 + uStack_e0 & 0xffffffff) * 0xffffadfd + 0x4000;
  auVar52._0_4_ = (int)(short)(uVar6 * 0x41b3 + lVar108 + lVar64 >> 0xf);
  auVar52._4_4_ = (int)(short)(uStack_1f0 * 0x41b3 + lVar112 + lVar111 >> 0xf);
  auVar52._8_4_ = (int)(short)(uVar33 * 0x41b3 + lVar136 + lVar54 >> 0xf);
  auVar52._12_4_ = (int)(short)(uStack_120 * 0x41b3 + lVar141 + lVar107 >> 0xf);
  auVar46._0_4_ = (int)(short)(uVar17 * 0x41b3 + lVar135 + lVar53 >> 0xf);
  auVar46._4_4_ = (int)(short)(uStack_1c0 * 0x41b3 + lVar91 + lVar73 >> 0xf);
  auVar46._8_4_ = (int)(short)(uVar118 * 0x41b3 + lVar114 + lVar18 >> 0xf);
  auVar46._12_4_ = (int)(short)(uStack_f0 * 0x41b3 + lVar117 + lVar48 >> 0xf);
  auVar51 = packssdw(auVar46,auVar52);
  *(undefined1 (*) [16])(data + 0x28) = auVar51;
  auVar110._0_4_ = (int)(short)(lVar108 + uVar5 * 0x6254 + lVar144 >> 0xf);
  auVar110._4_4_ = (int)(short)(lVar112 + uStack_180 * 0x6254 + lVar150 >> 0xf);
  auVar110._8_4_ = (int)(short)(lVar136 + uVar31 * 0x6254 + lVar119 >> 0xf);
  auVar110._12_4_ = (int)(short)(lVar141 + uStack_1a0 * 0x6254 + lVar127 >> 0xf);
  auVar89._0_4_ = (int)(short)(lVar135 + uVar4 * 0x6254 + lVar113 >> 0xf);
  auVar89._4_4_ = (int)(short)(lVar91 + uStack_1b0 * 0x6254 + lVar116 >> 0xf);
  auVar89._8_4_ = (int)(short)(lVar114 + uVar30 * 0x6254 + lVar129 >> 0xf);
  auVar89._12_4_ = (int)(short)(lVar117 + uStack_e0 * 0x6254 + lVar133 >> 0xf);
  auVar51 = packssdw(auVar89,auVar110);
  *(undefined1 (*) [16])(data + 0x18) = auVar51;
  auVar124._0_4_ = (int)(short)(lVar120 + uVar3 * 0x300b + lVar64 >> 0xf);
  auVar124._4_4_ = (int)(short)(lVar128 + uStack_170 * 0x300b + lVar111 >> 0xf);
  auVar124._8_4_ = (int)(short)(lVar93 + uVar29 * 0x300b + lVar54 >> 0xf);
  auVar124._12_4_ = (int)(short)(lVar96 + uStack_160 * 0x300b + lVar107 >> 0xf);
  auVar131._0_4_ = (int)(short)(lVar130 + uVar2 * 0x300b + lVar53 >> 0xf);
  auVar131._4_4_ = (int)(short)(lVar134 + uStack_190 * 0x300b + lVar73 >> 0xf);
  auVar131._8_4_ = (int)(short)(lVar98 + uVar28 * 0x300b + lVar18 >> 0xf);
  auVar131._12_4_ = (int)(short)(lVar105 + uStack_d0 * 0x300b + lVar48 >> 0xf);
  auVar51 = packssdw(auVar131,auVar124);
  *(undefined1 (*) [16])(data + 8) = auVar51;
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_islow(DCTELEM *data)
{
  JLONG tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  JLONG tmp10, tmp11, tmp12, tmp13;
  JLONG z1, z2, z3, z4, z5;
  DCTELEM *dataptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[0] + dataptr[7];
    tmp7 = dataptr[0] - dataptr[7];
    tmp1 = dataptr[1] + dataptr[6];
    tmp6 = dataptr[1] - dataptr[6];
    tmp2 = dataptr[2] + dataptr[5];
    tmp5 = dataptr[2] - dataptr[5];
    tmp3 = dataptr[3] + dataptr[4];
    tmp4 = dataptr[3] - dataptr[4];

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[0] = (DCTELEM)LEFT_SHIFT(tmp10 + tmp11, PASS1_BITS);
    dataptr[4] = (DCTELEM)LEFT_SHIFT(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[2] = (DCTELEM)DESCALE(z1 + MULTIPLY(tmp13, FIX_0_765366865),
                                  CONST_BITS - PASS1_BITS);
    dataptr[6] = (DCTELEM)DESCALE(z1 + MULTIPLY(tmp12, -FIX_1_847759065),
                                  CONST_BITS - PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents cos(K*pi/16).
     * i0..i3 in the paper are tmp4..tmp7 here.
     */

    z1 = tmp4 + tmp7;
    z2 = tmp5 + tmp6;
    z3 = tmp4 + tmp6;
    z4 = tmp5 + tmp7;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp4 = MULTIPLY(tmp4, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp5 = MULTIPLY(tmp5, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp6 = MULTIPLY(tmp6, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp7 = MULTIPLY(tmp7, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    dataptr[7] = (DCTELEM)DESCALE(tmp4 + z1 + z3, CONST_BITS - PASS1_BITS);
    dataptr[5] = (DCTELEM)DESCALE(tmp5 + z2 + z4, CONST_BITS - PASS1_BITS);
    dataptr[3] = (DCTELEM)DESCALE(tmp6 + z2 + z3, CONST_BITS - PASS1_BITS);
    dataptr[1] = (DCTELEM)DESCALE(tmp7 + z1 + z4, CONST_BITS - PASS1_BITS);

    dataptr += DCTSIZE;         /* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE * 0] + dataptr[DCTSIZE * 7];
    tmp7 = dataptr[DCTSIZE * 0] - dataptr[DCTSIZE * 7];
    tmp1 = dataptr[DCTSIZE * 1] + dataptr[DCTSIZE * 6];
    tmp6 = dataptr[DCTSIZE * 1] - dataptr[DCTSIZE * 6];
    tmp2 = dataptr[DCTSIZE * 2] + dataptr[DCTSIZE * 5];
    tmp5 = dataptr[DCTSIZE * 2] - dataptr[DCTSIZE * 5];
    tmp3 = dataptr[DCTSIZE * 3] + dataptr[DCTSIZE * 4];
    tmp4 = dataptr[DCTSIZE * 3] - dataptr[DCTSIZE * 4];

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE * 0] = (DCTELEM)DESCALE(tmp10 + tmp11, PASS1_BITS);
    dataptr[DCTSIZE * 4] = (DCTELEM)DESCALE(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[DCTSIZE * 2] =
      (DCTELEM)DESCALE(z1 + MULTIPLY(tmp13, FIX_0_765366865),
                       CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 6] =
      (DCTELEM)DESCALE(z1 + MULTIPLY(tmp12, -FIX_1_847759065),
                       CONST_BITS + PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents cos(K*pi/16).
     * i0..i3 in the paper are tmp4..tmp7 here.
     */

    z1 = tmp4 + tmp7;
    z2 = tmp5 + tmp6;
    z3 = tmp4 + tmp6;
    z4 = tmp5 + tmp7;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp4 = MULTIPLY(tmp4, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp5 = MULTIPLY(tmp5, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp6 = MULTIPLY(tmp6, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp7 = MULTIPLY(tmp7, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    dataptr[DCTSIZE * 7] = (DCTELEM)DESCALE(tmp4 + z1 + z3,
                                            CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 5] = (DCTELEM)DESCALE(tmp5 + z2 + z4,
                                            CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 3] = (DCTELEM)DESCALE(tmp6 + z2 + z3,
                                            CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 1] = (DCTELEM)DESCALE(tmp7 + z1 + z4,
                                            CONST_BITS + PASS1_BITS);

    dataptr++;                  /* advance pointer to next column */
  }
}